

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

void __thiscall argparse::Argument::validate(Argument *this)

{
  byte bVar1;
  size_t sVar2;
  pointer paVar3;
  pointer paVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  long lVar7;
  string local_1c0 [32];
  stringstream stream;
  ostream local_190 [376];
  
  lVar7 = (long)this->mNumArgs;
  if (-1 < lVar7) {
    bVar1 = this->field_0xac;
    if ((bVar1 & 1) == 0) {
      if (((long)(this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                 super__Vector_impl_data._M_start >> 4 != lVar7) &&
         ((this->mDefaultValue)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&stream);
        sVar2 = (this->mUsedName)._M_len;
        if (sVar2 != 0) {
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_190,(this->mUsedName)._M_str,sVar2);
          std::operator<<(poVar5,": ");
        }
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
        poVar5 = std::operator<<(poVar5," argument(s) expected. ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::operator<<(poVar5," provided.");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,local_1c0);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else if ((bVar1 & 4) == 0) {
      if (((bVar1 & 2) != 0) &&
         ((this->mDefaultValue)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&stream);
        poVar5 = std::operator<<(local_190,
                                 (string *)
                                 (this->mNames).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
        std::operator<<(poVar5,": required.");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,local_1c0);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      paVar3 = (this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
               super__Vector_impl_data._M_finish;
      paVar4 = (this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (((long)paVar3 - (long)paVar4 >> 4 != lVar7) &&
         ((this->mDefaultValue)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&stream);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_190,(this->mUsedName)._M_str,(this->mUsedName)._M_len);
        poVar5 = std::operator<<(poVar5,": expected ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        poVar5 = std::operator<<(poVar5," argument(s). ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::operator<<(poVar5," provided.");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,local_1c0);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (paVar3 == paVar4 && (~bVar1 & 6) == 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&stream);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_190,(this->mUsedName)._M_str,(this->mUsedName)._M_len);
        std::operator<<(poVar5,": no value provided.");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,local_1c0);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  return;
}

Assistant:

auto maybe_nargs() const -> std::optional<size_t> {
    if (mNumArgs < 0)
      return std::nullopt;
    else
      return static_cast<size_t>(mNumArgs);
  }